

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstCountPass.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1cd5::InstCountPass::runOnFunction(InstCountPass *this,Function *F)

{
  raw_ostream *prVar1;
  Function *pFVar2;
  Function *pFVar3;
  Function *pFVar4;
  ulong uVar5;
  StringRef SVar6;
  StringRef Str;
  StringRef Str_00;
  
  prVar1 = (raw_ostream *)llvm::errs();
  SVar6.Length = 9;
  SVar6.Data = "Function ";
  prVar1 = llvm::raw_ostream::operator<<(prVar1,SVar6);
  SVar6 = (StringRef)llvm::Value::getName();
  prVar1 = llvm::raw_ostream::operator<<(prVar1,SVar6);
  Str.Length = 10;
  Str.Data = " contains ";
  llvm::raw_ostream::operator<<(prVar1,Str);
  pFVar2 = *(Function **)(F + 0x50);
  uVar5 = 0;
  if (pFVar2 != F + 0x48) {
    do {
      pFVar3 = pFVar2 + -0x18;
      if (pFVar2 == (Function *)0x0) {
        pFVar3 = (Function *)0x0;
      }
      for (pFVar4 = *(Function **)(pFVar3 + 0x30); pFVar4 != pFVar3 + 0x28;
          pFVar4 = *(Function **)(pFVar4 + 8)) {
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      pFVar2 = *(Function **)(pFVar2 + 8);
    } while (pFVar2 != F + 0x48);
    uVar5 = (ulong)(int)uVar5;
  }
  prVar1 = (raw_ostream *)llvm::errs();
  prVar1 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar1,uVar5);
  Str_00.Length = 0x13;
  Str_00.Data = " LLVM instructions\n";
  llvm::raw_ostream::operator<<(prVar1,Str_00);
  return false;
}

Assistant:

bool InstCountPass::runOnFunction(Function &F) {
    errs() << "Function " << F.getName() << " contains ";
    int instcount = 0;
    for (auto& bb : F) {
      for (auto& i : bb) {
        instcount++;
      }
    }
    errs() << instcount << " LLVM instructions\n";
    return false; 
}